

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t read_mac_metadata_blob(archive_read *a,archive_entry *entry,size_t *unconsumed)

{
  size_t min;
  void *p;
  void *data;
  size_t msize;
  int64_t size;
  size_t *unconsumed_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  min = archive_entry_size(entry);
  if ((long)min < 0) {
    *unconsumed = 0;
    a_local._4_4_ = L'\xffffffe2';
  }
  else if ((long)min < 0x1000001) {
    tar_flush_unconsumed(a,unconsumed);
    p = __archive_read_ahead(a,min,(ssize_t *)0x0);
    if (p == (void *)0x0) {
      archive_set_error(&a->archive,0x16,"Truncated archive detected while reading macOS metadata");
      *unconsumed = 0;
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      archive_entry_clear(entry);
      archive_entry_copy_mac_metadata(entry,p,min);
      *unconsumed = min + 0x1ff & 0xfffffffffffffe00;
      a_local._4_4_ = L'\0';
    }
  }
  else {
    archive_set_error(&a->archive,-1,"Oversized AppleDouble extension has size %llu > %llu",min,
                      0x1000000);
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
read_mac_metadata_blob(struct archive_read *a,
    struct archive_entry *entry, size_t *unconsumed)
{
	int64_t size;
	size_t msize;
	const void *data;

 	/* Read the body as a Mac OS metadata blob. */
	size = archive_entry_size(entry);
	msize = (size_t)size;
	if (size < 0 || (uintmax_t)msize != (uintmax_t)size) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}

	/* TODO: Should this merely skip the overlarge entry and
	 * WARN?  Or is xattr_limit sufficiently large that we can
	 * safely assume anything larger is malicious? */
	if (size > (int64_t)xattr_limit) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Oversized AppleDouble extension has size %llu > %llu",
		    (unsigned long long)size,
		    (unsigned long long)xattr_limit);
		return (ARCHIVE_FATAL);
	}

	/*
	 * TODO: Look beyond the body here to peek at the next header.
	 * If it's a regular header (not an extension header)
	 * that has the wrong name, just return the current
	 * entry as-is, without consuming the body here.
	 * That would reduce the risk of us mis-identifying
	 * an ordinary file that just happened to have
	 * a name starting with "._".
	 *
	 * Q: Is the above idea really possible?  Even
	 * when there are GNU or pax extension entries?
	 */
	tar_flush_unconsumed(a, unconsumed);
	data = __archive_read_ahead(a, msize, NULL);
	if (data == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "Truncated archive"
		    " detected while reading macOS metadata");
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	archive_entry_clear(entry);
	archive_entry_copy_mac_metadata(entry, data, msize);
	*unconsumed = (msize + 511) & ~ 511;
	return (ARCHIVE_OK);
}